

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::PostDepthSampleMaskCase::iterate(PostDepthSampleMaskCase *this)

{
  string *__x;
  pointer pbVar1;
  pointer *pppSVar2;
  glUniform1iFunc p_Var3;
  GLuint program;
  Functions *gl;
  char cVar4;
  int iVar5;
  GLenum GVar6;
  GLint GVar7;
  undefined4 extraout_var;
  ShaderProgram *pSVar8;
  undefined8 *puVar9;
  int i_1;
  int n;
  long lVar10;
  GLint i;
  long lVar11;
  long *plVar12;
  char *pcVar13;
  long *plVar14;
  long *plVar15;
  bool bVar16;
  GLboolean compiledMask [4];
  GLboolean expectedMask [4];
  GLuint indicesPre [3];
  GLfloat samplePos [2];
  GLubyte pixels [16];
  GLfloat texCoord [8];
  ShaderProgram program1a;
  ProgramSources sources1a;
  GLuint indicesPost [6];
  VertexArrayBinding vertexArraysPost [2];
  VertexArrayBinding vertexArraysFar [2];
  VertexArrayBinding vertexArraysNear [2];
  GLfloat verticesFar [9];
  GLfloat verticesNear [9];
  GLfloat verticesPost [12];
  ShaderProgram program2;
  ShaderProgram program1b;
  ProgramSources sources2;
  ProgramSources sources1b;
  ulong local_990;
  char local_988 [4];
  GLenum local_984;
  GLuint local_980;
  char acStack_97c [4];
  ulong local_978;
  undefined8 local_970;
  undefined4 local_968;
  Functions *local_960;
  undefined1 local_958 [8];
  _func_int **local_950;
  undefined8 *local_948;
  _func_int *local_940 [2];
  int local_930;
  ios_base local_8e0 [264];
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined1 *puStack_7b0;
  ShaderProgram local_7a8;
  undefined1 local_6d8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c0 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_648;
  undefined1 local_628 [32];
  undefined4 local_608;
  undefined4 uStack_604;
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  undefined8 local_5f8;
  undefined1 local_5e8 [8];
  _Alloc_hider local_5e0;
  char local_5d0 [16];
  int local_5c0;
  VertexComponentType local_5b8;
  VertexComponentConversion VStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  int local_5a8;
  undefined8 *local_5a0;
  GLfloat local_598;
  long *local_590 [2];
  long local_580 [3];
  undefined8 local_568;
  undefined8 uStack_560;
  undefined4 local_558;
  undefined8 *local_550;
  undefined1 local_548 [8];
  _Alloc_hider local_540;
  char local_530 [16];
  int local_520;
  VertexComponentType local_518;
  VertexComponentConversion VStack_514;
  int iStack_510;
  int iStack_50c;
  int local_508;
  undefined8 *local_500;
  GLfloat local_4f8;
  long *local_4f0 [2];
  long local_4e0 [3];
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined4 local_4b8;
  undefined8 *local_4b0;
  undefined1 local_4a8 [8];
  _Alloc_hider local_4a0;
  char local_490 [16];
  int local_480;
  VertexComponentType local_478;
  VertexComponentConversion VStack_474;
  int iStack_470;
  int iStack_46c;
  int local_468;
  undefined8 *local_460;
  GLfloat local_458;
  long *local_450 [2];
  long local_440 [3];
  undefined8 local_428;
  undefined8 uStack_420;
  undefined4 local_418;
  undefined8 *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3e8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined4 local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ShaderProgram local_370;
  ShaderProgram local_2a0;
  ProgramSources local_1d0;
  ProgramSources local_100;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_7b8 = 0x3f80000000000000;
  puStack_7b0 = &DAT_3f8000003f800000;
  local_7c8 = 0;
  uStack_7c0 = 0x3f800000;
  local_3c8 = 0x3e800000bf800000;
  uStack_3c0 = 0x3ecccccdbf800000;
  local_3d8 = 0xbf800000bf800000;
  uStack_3d0 = 0x3ecccccd3e800000;
  local_3b8 = 0x3e800000;
  local_3f8 = 0x3f400000bf800000;
  uStack_3f0 = 0x40400000bf800000;
  local_408 = 0xbf800000bf800000;
  uStack_400 = 0x404000003f400000;
  local_3e8 = 0x3f400000;
  local_388 = 0x3f80000000000000;
  uStack_380 = 0x3f800000;
  local_398 = 0xbf800000;
  uStack_390 = 0x3f800000bf800000;
  local_3a8 = 0xbf800000bf800000;
  uStack_3a0 = 0x3f80000000000000;
  local_970 = 0x100000000;
  local_968 = 2;
  local_5f8 = 0x300000002;
  local_608 = 0;
  uStack_604 = 1;
  uStack_600 = 2;
  uStack_5fc = 1;
  pbVar1 = (pointer)(local_6d8 + 0x10);
  local_6d8._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"vertex","");
  local_958._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_950 = local_940;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_950,local_6d8._0_8_,
             (undefined1 *)((long)&((_Alloc_hider *)local_6d8._8_8_)->_M_p + local_6d8._0_8_));
  local_930 = 0;
  local_4a8._0_4_ = local_958._0_4_;
  local_4a0._M_p = local_490;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a0,local_950,(long)local_948 + (long)local_950);
  local_480 = local_930;
  local_478 = VTX_COMP_FLOAT;
  VStack_474 = VTX_COMP_CONVERT_NONE;
  iStack_470 = 3;
  iStack_46c = 3;
  local_468 = 0;
  local_460 = &local_3d8;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  pppSVar2 = &local_7a8.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_7a8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppSVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"inTexCoord","");
  local_958._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_950 = local_940;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_950,
             local_7a8.m_shaders[0].
             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_7a8.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_finish +
             (long)local_7a8.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start));
  local_930 = 0;
  local_458 = (GLfloat)local_958._0_4_;
  plVar12 = local_440;
  local_450[0] = plVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_450,local_950,(long)local_948 + (long)local_950);
  local_440[2]._0_4_ = local_930;
  local_428 = 8;
  uStack_420 = 0x300000002;
  local_418 = 0;
  local_410 = &local_7c8;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  if (local_7a8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)pppSVar2) {
    operator_delete(local_7a8.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_7a8.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((pointer)local_6d8._0_8_ != pbVar1) {
    operator_delete((void *)local_6d8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_6d8._16_8_)->_M_p + 1));
  }
  local_6d8._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"vertex","");
  local_958._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_950 = local_940;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_950,local_6d8._0_8_,
             (undefined1 *)((long)&((_Alloc_hider *)local_6d8._8_8_)->_M_p + local_6d8._0_8_));
  local_930 = 0;
  local_548._0_4_ = local_958._0_4_;
  local_540._M_p = local_530;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_540,local_950,(long)local_948 + (long)local_950);
  local_520 = local_930;
  local_518 = VTX_COMP_FLOAT;
  VStack_514 = VTX_COMP_CONVERT_NONE;
  iStack_510 = 3;
  iStack_50c = 3;
  local_508 = 0;
  local_500 = &local_408;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  local_7a8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppSVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"inTexCoord","");
  local_958._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_950 = local_940;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_950,
             local_7a8.m_shaders[0].
             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_7a8.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_finish +
             (long)local_7a8.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start));
  local_930 = 0;
  local_4f8 = (GLfloat)local_958._0_4_;
  plVar14 = local_4e0;
  local_4f0[0] = plVar14;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4f0,local_950,(long)local_948 + (long)local_950);
  local_4e0[2]._0_4_ = local_930;
  local_4c8 = 8;
  uStack_4c0 = 0x300000002;
  local_4b8 = 0;
  local_4b0 = &local_7c8;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  if (local_7a8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)pppSVar2) {
    operator_delete(local_7a8.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_7a8.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((pointer)local_6d8._0_8_ != pbVar1) {
    operator_delete((void *)local_6d8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_6d8._16_8_)->_M_p + 1));
  }
  local_6d8._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"vertex","");
  local_958._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_950 = local_940;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_950,local_6d8._0_8_,
             (undefined1 *)((long)&((_Alloc_hider *)local_6d8._8_8_)->_M_p + local_6d8._0_8_));
  local_930 = 0;
  local_5e8._0_4_ = local_958._0_4_;
  local_5e0._M_p = local_5d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e0,local_950,(long)local_948 + (long)local_950);
  local_5c0 = local_930;
  local_5b8 = VTX_COMP_FLOAT;
  VStack_5b4 = VTX_COMP_CONVERT_NONE;
  iStack_5b0 = 3;
  iStack_5ac = 4;
  local_5a8 = 0;
  local_5a0 = &local_3a8;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  local_7a8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppSVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"inTexCoord","");
  local_958._0_4_ = 1;
  local_950 = local_940;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_950,
             local_7a8.m_shaders[0].
             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_7a8.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_finish +
             (long)local_7a8.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
  local_930 = 0;
  local_598 = (GLfloat)local_958._0_4_;
  plVar15 = local_580;
  local_590[0] = plVar15;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_590,local_950,(long)local_948 + (long)local_950);
  local_580[2]._0_4_ = local_930;
  local_568 = 8;
  uStack_560 = 0x400000002;
  local_558 = 0;
  local_550 = &local_7c8;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  if (local_7a8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)pppSVar2) {
    operator_delete(local_7a8.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_7a8.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  local_960 = (Functions *)CONCAT44(extraout_var,iVar5);
  if ((pointer)local_6d8._0_8_ != (pointer)(local_6d8 + 0x10)) {
    operator_delete((void *)local_6d8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_6d8._16_8_)->_M_p + 1));
  }
  __x = &this->m_vertShader;
  local_628[0x10] = 0;
  local_628._17_8_ = 0;
  local_628._0_8_ = (pointer)0x0;
  local_628[8] = 0;
  local_628._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_6d8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6d8,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_6c0,&this->m_fragShader1a);
  gl = local_960;
  glu::ShaderProgram::ShaderProgram(&local_7a8,local_960,(ProgramSources *)local_6d8);
  if (local_7a8.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader program fail (non post_depth_coverage).");
    local_958 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_950);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Vertex: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_950,
               (char *)*(pointer)((long)*local_7a8.m_shaders[0].
                                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 0x38),
               (long)*(pointer)((long)*local_7a8.m_shaders[0].
                                       super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 0x40));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Fragment: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_950,
               ((*local_7a8.m_shaders[1].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
               ((*local_7a8.m_shaders[1].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Program: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_950,local_7a8.m_program.m_info.infoLog._M_dataplus._M_p,
               local_7a8.m_program.m_info.infoLog._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_958,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_950);
    std::ios_base::~ios_base(local_8e0);
  }
  else {
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    memset(&local_100,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources,__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + 1,&this->m_fragShader1b);
    glu::ShaderProgram::ShaderProgram(&local_2a0,gl,&local_100);
    if (local_2a0.m_program.m_info.linkOk == false) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Shader program fail (post_depth_coverage).");
      local_958 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_950);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_950,"PostDepthCoverage: enabled\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Vertex: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_950,
                 ((*local_2a0.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                 ((*local_2a0.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Fragment: ",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_950,
                 ((*local_2a0.m_shaders[1].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                 ((*local_2a0.m_shaders[1].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Program: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_950,local_2a0.m_program.m_info.infoLog._M_dataplus._M_p,
                 local_2a0.m_program.m_info.infoLog._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_958,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_950);
      std::ios_base::~ios_base(local_8e0);
    }
    else {
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_1d0._193_8_ = 0;
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      memset(&local_1d0,0,0xac);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_1d0.sources,__x);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_1d0.sources + 1,&this->m_fragShader2);
      glu::ShaderProgram::ShaderProgram(&local_370,gl,&local_1d0);
      if (local_370.m_program.m_info.linkOk == false) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Shader program fail (samples reader).");
        local_958 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_950);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Vertex: ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_950,
                   ((*local_370.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                   ((*local_370.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Fragment: ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_950,
                   ((*local_370.m_shaders[1].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                   ((*local_370.m_shaders[1].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Program: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_950,local_370.m_program.m_info.infoLog._M_dataplus._M_p,
                   local_370.m_program.m_info.infoLog._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_958,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_950);
        std::ios_base::~ios_base(local_8e0);
      }
      else {
        (*gl->clearColor)(0.0,0.0,0.0,0.0);
        local_990 = 0;
        (*gl->clearStencil)(0);
        local_978 = 0;
        do {
          local_984 = 0xb90;
          if ((uint)local_990 == 0) {
            local_984 = 0xb71;
          }
          iVar5 = 0;
          do {
            pSVar8 = &local_2a0;
            if (iVar5 == 0) {
              pSVar8 = &local_7a8;
            }
            local_980 = (pSVar8->m_program).m_program;
            (*gl->useProgram)(local_980);
            (*gl->bindFramebuffer)(0x8d40,this->m_framebufferMS);
            (*gl->viewport)(0,0,1,1);
            (*gl->enable)(0x809d);
            lVar11 = 0;
            do {
              (*gl->getMultisamplefv)(0x8e50,(GLuint)lVar11,(GLfloat *)local_958);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glGetMultisamplefv",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPostDepthCoverageTests.cpp"
                              ,0x1aa);
              if (iVar5 == 1) {
                if (0.7 <= (float)local_958._0_4_ + (float)local_958._4_4_) goto LAB_00a7a716;
                cVar4 = '\0';
              }
              else {
LAB_00a7a716:
                cVar4 = '\x01';
              }
              acStack_97c[lVar11] = cVar4;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            (*gl->enable)(local_984);
            program = local_980;
            (*gl->clear)(0x4500);
            if ((uint)local_990 == 1) {
              (*gl->stencilFunc)(0x207,1,0xff);
              (*gl->stencilOp)(0,0x1e01,0x1e01);
              (*gl->stencilMask)(0xff);
            }
            local_958 = (undefined1  [8])0x300000001;
            local_950 = (_func_int **)CONCAT44(local_950._4_4_,INDEXTYPE_UINT32);
            local_948 = &local_970;
            glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program,2,
                      (VertexArrayBinding *)local_4a8,(PrimitiveList *)local_958,
                      (DrawUtilCallback *)0x0);
            (*gl->clear)(0x4000);
            if ((uint)local_990 == 1) {
              (*gl->stencilFunc)(0x205,1,0xff);
              (*gl->stencilMask)(0);
            }
            local_958 = (undefined1  [8])0x300000001;
            local_950 = (_func_int **)CONCAT44(local_950._4_4_,INDEXTYPE_UINT32);
            local_948 = &local_970;
            glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program,2,
                      (VertexArrayBinding *)local_548,(PrimitiveList *)local_958,
                      (DrawUtilCallback *)0x0);
            (*gl->disable)(0xb71);
            if ((uint)local_990 < 2) {
              (*gl->disable)(local_984);
            }
            (*gl->bindFramebuffer)(0x8d40,0);
            (*gl->useProgram)(local_370.m_program.m_program);
            (*gl->bindFramebuffer)(0x8d40,this->m_framebuffer);
            (*gl->viewport)(0,0,1,4);
            (*gl->activeTexture)(0x84c0);
            (*gl->bindTexture)(0x9100,this->m_textureMS);
            p_Var3 = gl->uniform1i;
            GVar7 = (*gl->getUniformLocation)(local_370.m_program.m_program,"texture");
            (*p_Var3)(GVar7,0);
            (*gl->clear)(0x4500);
            local_958 = (undefined1  [8])&DAT_600000001;
            local_950 = (_func_int **)CONCAT44(local_950._4_4_,2);
            local_948 = (undefined8 *)&local_608;
            glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_370.m_program.m_program,
                      2,(VertexArrayBinding *)local_5e8,(PrimitiveList *)local_958,
                      (DrawUtilCallback *)0x0);
            (*gl->disable)(0x809d);
            local_7d8 = 0;
            uStack_7d0 = 0;
            (*gl->readPixels)(0,0,1,4,0x1908,0x1401,&local_7d8);
            GVar6 = (*gl->getError)();
            glu::checkError(GVar6,"glReadPixels",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPostDepthCoverageTests.cpp"
                            ,0x1ee);
            local_988[0] = '\0';
            local_988[1] = '\0';
            local_988[2] = '\0';
            local_988[3] = '\0';
            puVar9 = &local_7d8;
            lVar11 = 0;
            do {
              lVar10 = 0;
              do {
                bVar16 = true;
                if (local_988[lVar10] == '\0') {
                  bVar16 = *(char *)((long)puVar9 + lVar10) != '\0';
                }
                local_988[lVar10] = bVar16;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              lVar11 = lVar11 + 1;
              puVar9 = (undefined8 *)((long)puVar9 + 4);
            } while (lVar11 != 4);
            lVar11 = 0;
            do {
              if (acStack_97c[lVar11] != local_988[lVar11]) {
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,"Fail");
                local_958 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_950);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_950,"Wrong results for ",0x12);
                pcVar13 = "BUFFERCASE_DEPTH_STENCIL";
                if ((uint)local_990 == 0) {
                  pcVar13 = "BUFFERCASE_DEPTH";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_950,pcVar13,(ulong)((uint)local_990 != 0) * 8 + 0x10);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950," / ",3);
                pcVar13 = "PDCCASE_ENABLED";
                if (iVar5 == 0) {
                  pcVar13 = "PDCCASE_DISABLED";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_950,pcVar13,(ulong)(iVar5 == 0) + 0xf);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_958,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_950);
                std::ios_base::~ios_base(local_8e0);
                if ((local_978 & 1) == 0) goto LAB_00a7ae88;
                goto LAB_00a7ae76;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            bVar16 = iVar5 == 0;
            iVar5 = iVar5 + 1;
          } while (bVar16);
          bVar16 = (uint)local_990 == 0;
          local_978 = CONCAT71((int7)(local_990 >> 8),!bVar16);
          local_990 = (ulong)((uint)local_990 + 1);
        } while (bVar16);
LAB_00a7ae76:
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
LAB_00a7ae88:
      glu::ShaderProgram::~ShaderProgram(&local_370);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d0.transformFeedbackVaryings);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_1d0.attribLocationBindings);
      lVar11 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&local_1d0.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar11));
        lVar11 = lVar11 + -0x18;
      } while (lVar11 != -0x18);
    }
    glu::ShaderProgram::~ShaderProgram(&local_2a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar11 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11));
      lVar11 = lVar11 + -0x18;
    } while (lVar11 != -0x18);
  }
  glu::ShaderProgram::~ShaderProgram(&local_7a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_628);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_648);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_6d8 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  lVar11 = -0xa0;
  do {
    if (plVar15 != (long *)plVar15[-2]) {
      operator_delete((long *)plVar15[-2],*plVar15 + 1);
    }
    plVar15 = plVar15 + -10;
    lVar11 = lVar11 + 0x50;
  } while (lVar11 != 0);
  lVar11 = -0xa0;
  do {
    if (plVar14 != (long *)plVar14[-2]) {
      operator_delete((long *)plVar14[-2],*plVar14 + 1);
    }
    plVar14 = plVar14 + -10;
    lVar11 = lVar11 + 0x50;
  } while (lVar11 != 0);
  lVar11 = -0xa0;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    plVar12 = plVar12 + -10;
    lVar11 = lVar11 + 0x50;
  } while (lVar11 != 0);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult PostDepthSampleMaskCase::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	const GLfloat texCoord[] = {
		0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 1.0f, 1.0f, 1.0f,
	};

	const GLfloat verticesNear[] = {
		-1.0f, -1.0f, 0.25f, 0.4f, -1.0f, 0.25f, -1.0f, 0.4f, 0.25f,
	};

	const GLfloat verticesFar[] = {
		-1.0f, -1.0f, 0.75f, 3.0f, -1.0f, 0.75f, -1.0f, 3.0f, 0.75f,
	};

	const GLfloat verticesPost[] = {
		-1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 0.0f, -1.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f,
	};

	const GLuint indicesPre[] = { 0, 1, 2 };

	const GLuint indicesPost[] = { 0, 1, 2, 1, 2, 3 };

	glu::VertexArrayBinding vertexArraysNear[] = { glu::va::Float("vertex", 3, 3, 0, verticesNear),
												   glu::va::Float("inTexCoord", 2, 3, 0, texCoord) };

	glu::VertexArrayBinding vertexArraysFar[] = { glu::va::Float("vertex", 3, 3, 0, verticesFar),
												  glu::va::Float("inTexCoord", 2, 3, 0, texCoord) };

	glu::VertexArrayBinding vertexArraysPost[] = { glu::va::Float("vertex", 3, 4, 0, verticesPost),
												   glu::va::Float("inTexCoord", 2, 4, 0, texCoord) };

	//Prepare shaders
	ProgramSources sources1a = makeVtxFragSources(m_vertShader, m_fragShader1a);
	ShaderProgram  program1a(gl, sources1a);

	if (!program1a.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (non post_depth_coverage).");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program1a.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program1a.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1a.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources1b = makeVtxFragSources(m_vertShader, m_fragShader1b);
	ShaderProgram  program1b(gl, sources1b);

	if (!program1b.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (post_depth_coverage).");
		m_testCtx.getLog() << tcu::TestLog::Message << "PostDepthCoverage: enabled\n"
						   << "Vertex: " << program1b.getShaderInfo(SHADERTYPE_VERTEX).infoLog << "\n"
						   << "Fragment: " << program1b.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1b.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources2 = makeVtxFragSources(m_vertShader, m_fragShader2);
	ShaderProgram  program2(gl, sources2);

	if (!program2.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (samples reader).");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program2.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program2.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program2.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.clearStencil(0);

	//Iterate through all cases
	for (int bufferCase = BUFFERCASE_FIRST; bufferCase <= BUFFERCASE_LAST; ++bufferCase)
		for (int pdcCase = PDCCASE_FIRST; pdcCase <= PDCCASE_LAST; ++pdcCase)
		{
			GLint program = 0;
			if (pdcCase == PDCCASE_DISABLED)
				program = program1a.getProgram();
			else if (pdcCase == PDCCASE_ENABLED)
				program = program1b.getProgram();

			gl.useProgram(program);

			//Firstible use multisampled framebuffer
			gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebufferMS);
			gl.viewport(0, 0, 1, 1);

			gl.enable(GL_MULTISAMPLE);

			//Check which samples should be covered by first draw - calculate expected sample mask
			GLboolean expectedMask[4];

			for (GLint i = 0; i < 4; ++i)
			{
				GLfloat samplePos[2];
				gl.getMultisamplefv(GL_SAMPLE_POSITION, i, &samplePos[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetMultisamplefv");
				if (pdcCase == PDCCASE_ENABLED && (samplePos[0] + samplePos[1]) < 0.7f)
					expectedMask[i] = false;
				else
					expectedMask[i] = true;
			}

			if (bufferCase == BUFFERCASE_DEPTH)
				gl.enable(GL_DEPTH_TEST);
			else if (bufferCase == BUFFERCASE_STENCIL)
				gl.enable(GL_STENCIL_TEST);

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

			if (bufferCase == BUFFERCASE_STENCIL)
			{
				gl.stencilFunc(GL_ALWAYS, 1, 0xFF);
				gl.stencilOp(GL_ZERO, GL_REPLACE, GL_REPLACE);
				gl.stencilMask(0xFF);
			}

			//Draw near primitive
			glu::draw(m_context.getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArraysNear), vertexArraysNear,
					  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPre), indicesPre));

			gl.clear(GL_COLOR_BUFFER_BIT);

			if (bufferCase == BUFFERCASE_STENCIL)
			{
				gl.stencilFunc(GL_NOTEQUAL, 1, 0xFF);
				gl.stencilMask(0x00);
			}

			//Draw far primitive
			glu::draw(m_context.getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArraysFar), vertexArraysFar,
					  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPre), indicesPre));

			gl.disable(GL_DEPTH_TEST);
			if (bufferCase == BUFFERCASE_DEPTH)
				gl.disable(GL_DEPTH_TEST);
			else if (bufferCase == BUFFERCASE_STENCIL)
				gl.disable(GL_STENCIL_TEST);

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			gl.useProgram(program2.getProgram());

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
			gl.viewport(0, 0, 1, 4);

			//Pass multisampled texture as a uniform
			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_textureMS);
			gl.uniform1i(gl.getUniformLocation(program2.getProgram(), "texture"), 0);

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

			//Draw multisampled texture to framebuffer
			glu::draw(m_context.getRenderContext(), program2.getProgram(), DE_LENGTH_OF_ARRAY(vertexArraysPost),
					  vertexArraysPost, glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPost), indicesPost));

			gl.disable(GL_MULTISAMPLE);

			//Read data from framebuffer
			GLubyte pixels[4 * 4];
			deMemset(pixels, 0, 4 * 4);

			gl.readPixels(0, 0, 1, 4, GL_RGBA, GL_UNSIGNED_BYTE, pixels);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels");

			//Verify the result
			GLboolean compiledMask[4];
			deMemset(compiledMask, 0, 4);
			for (int i = 0; i < 4; ++i)
			{
				for (int n			= 0; n < 4; ++n)
					compiledMask[n] = compiledMask[n] || (pixels[4 * i + n] != 0);
			}

			for (int n = 0; n < 4; ++n)
			{
				if (expectedMask[n] != compiledMask[n])
				{
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					m_testCtx.getLog() << tcu::TestLog::Message << "Wrong results for "
									   << (bufferCase == BUFFERCASE_DEPTH ? "BUFFERCASE_DEPTH" :
																			"BUFFERCASE_DEPTH_STENCIL")
									   << " / "
									   << (pdcCase == PDCCASE_DISABLED ? "PDCCASE_DISABLED" : "PDCCASE_ENABLED")
									   << tcu::TestLog::EndMessage;
					return STOP;
				}
			}
		}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}